

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O0

void helper_v7m_vlldm_aarch64(CPUARMState_conflict *env,uint32_t fptr)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint64_t *puVar6;
  uintptr_t unaff_retaddr;
  uint local_44;
  uint32_t faddr;
  uint64_t dn;
  uint32_t shi;
  uint32_t slo;
  uint32_t fpscr;
  int i;
  _Bool ts;
  uintptr_t ra;
  uint32_t fptr_local;
  CPUARMState_conflict *env_local;
  
  if ((env->v7m).secure == 0) {
    __assert_fail("env->v7m.secure",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                  ,0x407,"void helper_v7m_vlldm_aarch64(CPUARMState *, uint32_t)");
  }
  if (((env->v7m).control[1] & 8) != 0) {
    iVar3 = arm_current_el(env);
    _Var2 = v7m_cpacr_pass(env,true,iVar3 != 0);
    if (!_Var2) {
      raise_exception_ra_aarch64(env,0x11,0,1,unaff_retaddr);
    }
    if (((env->v7m).fpccr[1] & 1) == 0) {
      uVar1 = (env->v7m).fpccr[1];
      if ((fptr & 7) != 0) {
        raise_exception_ra_aarch64(env,0x16,0,1,unaff_retaddr);
      }
      slo = 0;
      while( true ) {
        iVar3 = 0x10;
        if ((uVar1 & 0x4000000) != 0) {
          iVar3 = 0x20;
        }
        if (iVar3 <= (int)slo) break;
        local_44 = fptr + slo * 4;
        if (0xf < (int)slo) {
          local_44 = local_44 + 8;
        }
        uVar4 = cpu_ldl_data_ra_aarch64(env,(ulong)local_44,unaff_retaddr);
        uVar5 = cpu_ldl_data_ra_aarch64(env,(ulong)(local_44 + 4),unaff_retaddr);
        puVar6 = aa32_vfp_dreg(env,(int)slo / 2);
        *puVar6 = CONCAT44(uVar5,uVar4);
        slo = slo + 2;
      }
      uVar4 = cpu_ldl_data_ra_aarch64(env,(ulong)(fptr + 0x40),unaff_retaddr);
      vfp_set_fpscr_aarch64(env,uVar4);
    }
    else {
      (env->v7m).fpccr[1] = (env->v7m).fpccr[1] & 0xfffffffe;
    }
    (env->v7m).control[1] = (env->v7m).control[1] | 4;
  }
  return;
}

Assistant:

void HELPER(v7m_vlldm)(CPUARMState *env, uint32_t fptr)
{
    uintptr_t ra = GETPC();

    /* fptr is the value of Rn, the frame pointer we load the FP regs from */
    assert(env->v7m.secure);

    if (!(env->v7m.control[M_REG_S] & R_V7M_CONTROL_SFPA_MASK)) {
        return;
    }

    /* Check access to the coprocessor is permitted */
    if (!v7m_cpacr_pass(env, true, arm_current_el(env) != 0)) {
        raise_exception_ra(env, EXCP_NOCP, 0, 1, GETPC());
    }

    if (env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_LSPACT_MASK) {
        /* State in FP is still valid */
        env->v7m.fpccr[M_REG_S] &= ~R_V7M_FPCCR_LSPACT_MASK;
    } else {
        bool ts = env->v7m.fpccr[M_REG_S] & R_V7M_FPCCR_TS_MASK;
        int i;
        uint32_t fpscr;

        if (fptr & 7) {
            raise_exception_ra(env, EXCP_UNALIGNED, 0, 1, GETPC());
        }

        for (i = 0; i < (ts ? 32 : 16); i += 2) {
            uint32_t slo, shi;
            uint64_t dn;
            uint32_t faddr = fptr + 4 * i;

            if (i >= 16) {
                faddr += 8; /* skip the slot for the FPSCR */
            }

            slo = cpu_ldl_data_ra(env, faddr, ra);
            shi = cpu_ldl_data_ra(env, faddr + 4, ra);

            dn = (uint64_t) shi << 32 | slo;
            *aa32_vfp_dreg(env, i / 2) = dn;
        }
        fpscr = cpu_ldl_data_ra(env, fptr + 0x40, ra);
        vfp_set_fpscr(env, fpscr);
    }

    env->v7m.control[M_REG_S] |= R_V7M_CONTROL_FPCA_MASK;
}